

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * avro::toBin(string *s)

{
  char *__last;
  uchar *__result;
  long lVar1;
  uchar *__first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  
  this = in_RDI;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ddd75);
  std::__cxx11::string::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(size_type)in_RDI);
  __last = (char *)std::__cxx11::string::c_str();
  __result = (uchar *)std::__cxx11::string::c_str();
  lVar1 = std::__cxx11::string::size();
  __first = __result + lVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  std::copy<char_const*,unsigned_char*>((char *)__first,__last,__result);
  return in_RDI;
}

Assistant:

static vector<uint8_t> toBin(const std::string& s)
{
    vector<uint8_t> result;
    result.resize(s.size());
    std::copy(s.c_str(), s.c_str() + s.size(), &result[0]);
    return result;
}